

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_sifm.cc
# Opt level: O0

void __thiscall
hwtest::pgraph::anon_unknown_17::MthdDvdSrcFormat::emulate_mthd(MthdDvdSrcFormat *this)

{
  sbyte sVar1;
  sbyte sVar2;
  uint uVar3;
  uint local_18;
  int fmt;
  int sfmt;
  MthdDvdSrcFormat *this_local;
  
  sVar1 = 10;
  if (this->which != 0) {
    sVar1 = 0x10;
  }
  sVar2 = 10;
  if (this->which != 0) {
    sVar2 = 0x10;
  }
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] &
       ((uint)(1L << sVar1) ^ 0xffffffff) | (uint)(1L << sVar2);
  uVar3 = (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x2e) >> 0x3e);
  if (this->which == 0) {
    local_18 = 0;
    if (uVar3 == 1) {
      local_18 = 0x12;
    }
    if (uVar3 == 2) {
      local_18 = 0x13;
    }
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.dvd_format =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.dvd_format & 0xffffffc0 |
         local_18;
  }
  else {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.dvd_format =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.dvd_format & 0xfffffcff |
         uVar3 << 8;
  }
  return;
}

Assistant:

void emulate_mthd() override {
		insrt(exp.valid[0], which ? 16 : 10, 1, 1);
		int sfmt = extr(val, 16, 2);
		if (which == 0) {
			int fmt = 0;
			if (sfmt == 1)
				fmt = 0x12;
			if (sfmt == 2)
				fmt = 0x13;
			insrt(exp.dvd_format, 0, 6, fmt);
		} else {
			insrt(exp.dvd_format, 8, 2, sfmt);
		}
	}